

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::z_formatter<spdlog::details::scoped_padder>::format
          (z_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *tm_time,
          memory_buf_t *dest)

{
  int iVar1;
  char *in_RDI;
  bool is_negative;
  int total_minutes;
  scoped_padder p;
  size_t field_size;
  undefined4 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff99;
  undefined1 in_stack_ffffffffffffff9a;
  undefined1 in_stack_ffffffffffffff9b;
  undefined4 in_stack_ffffffffffffff9c;
  tm *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  memory_buf_t *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffbc;
  
  scoped_padder::scoped_padder
            ((scoped_padder *)in_stack_ffffffffffffffb0,
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             (padding_info *)in_stack_ffffffffffffffa0,
             (memory_buf_t *)
             CONCAT44(in_stack_ffffffffffffff9c,
                      CONCAT13(in_stack_ffffffffffffff9b,
                               CONCAT12(in_stack_ffffffffffffff9a,
                                        CONCAT11(in_stack_ffffffffffffff99,in_stack_ffffffffffffff98
                                                )))));
  iVar1 = get_cached_offset((z_formatter<spdlog::details::scoped_padder> *)in_stack_ffffffffffffffb0
                            ,(log_msg *)
                             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                            in_stack_ffffffffffffffa0);
  if (iVar1 < 0) {
    ::fmt::v8::detail::buffer<char>::push_back
              ((buffer<char> *)CONCAT44(iVar1,in_stack_ffffffffffffff90),in_RDI);
  }
  else {
    ::fmt::v8::detail::buffer<char>::push_back
              ((buffer<char> *)CONCAT44(iVar1,in_stack_ffffffffffffff90),in_RDI);
  }
  fmt_helper::pad2(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0);
  ::fmt::v8::detail::buffer<char>::push_back
            ((buffer<char> *)CONCAT44(iVar1,in_stack_ffffffffffffff90),in_RDI);
  fmt_helper::pad2(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0);
  scoped_padder::~scoped_padder((scoped_padder *)CONCAT44(iVar1,in_stack_ffffffffffffff90));
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 6;
        ScopedPadder p(field_size, padinfo_, dest);

        auto total_minutes = get_cached_offset(msg, tm_time);
        bool is_negative = total_minutes < 0;
        if (is_negative)
        {
            total_minutes = -total_minutes;
            dest.push_back('-');
        }
        else
        {
            dest.push_back('+');
        }

        fmt_helper::pad2(total_minutes / 60, dest); // hours
        dest.push_back(':');
        fmt_helper::pad2(total_minutes % 60, dest); // minutes
    }